

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.cpp
# Opt level: O2

void __thiscall CControls::ClampMousePos(CControls *this)

{
  float fVar1;
  CGameClient *pCVar2;
  vector2_base<float> vVar3;
  vec2 vVar4;
  float fVar5;
  float fVar6;
  
  pCVar2 = (this->super_CComponent).m_pClient;
  if (((pCVar2->m_Snap).m_SpecInfo.m_Active == true) &&
     ((pCVar2->m_Snap).m_SpecInfo.m_UsePosition == false)) {
    fVar5 = (float)((pCVar2->m_Collision).m_Width << 5) + -200.0;
    fVar6 = (this->m_MousePos).field_0.x;
    fVar1 = (this->m_MousePos).field_1.y;
    if (fVar6 <= fVar5) {
      fVar5 = fVar6;
    }
    (this->m_MousePos).field_0 =
         (anon_union_4_2_94730284_for_vector2_base<float>_1)
         (-(uint)(fVar6 < 200.0) & 0x43480000 | ~-(uint)(fVar6 < 200.0) & (uint)fVar5);
    fVar6 = (float)((pCVar2->m_Collision).m_Height << 5) + -200.0;
    if (fVar1 <= fVar6) {
      fVar6 = fVar1;
    }
    (this->m_MousePos).field_1 =
         (anon_union_4_2_947302a4_for_vector2_base<float>_3)
         (-(uint)(fVar1 < 200.0) & 0x43480000 | ~-(uint)(fVar1 < 200.0) & (uint)fVar6);
  }
  else {
    fVar5 = GetMaxMouseDistance(this);
    fVar6 = (this->m_MousePos).field_0.x;
    fVar1 = (this->m_MousePos).field_1.y;
    if (fVar5 * fVar5 < fVar6 * fVar6 + fVar1 * fVar1) {
      vVar3 = normalize(&this->m_MousePos);
      vVar4.field_1.y = fVar5 * vVar3.field_1.y;
      vVar4.field_0.x = fVar5 * vVar3.field_0.x;
      this->m_MousePos = vVar4;
    }
  }
  return;
}

Assistant:

void CControls::ClampMousePos()
{
	if(m_pClient->m_Snap.m_SpecInfo.m_Active && !m_pClient->m_Snap.m_SpecInfo.m_UsePosition)
	{
		m_MousePos.x = clamp(m_MousePos.x, 200.0f, Collision()->GetWidth()*32-200.0f);
		m_MousePos.y = clamp(m_MousePos.y, 200.0f, Collision()->GetHeight()*32-200.0f);
	}
	else
	{
		const float MouseMax = GetMaxMouseDistance();
		if(dot(m_MousePos, m_MousePos) > MouseMax * MouseMax)
			m_MousePos = normalize(m_MousePos) * MouseMax;
	}
}